

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O3

bool __thiscall
raspicam::_private::Private_Impl_Still::takePicture
          (Private_Impl_Still *this,uchar *preallocated_data,uint length)

{
  int iVar1;
  MMAL_PORT_USERDATA_T *pMVar2;
  sem_t mutex;
  sem_t local_50;
  
  initialize(this);
  sem_init(&local_50,0,0);
  pMVar2 = (MMAL_PORT_USERDATA_T *)operator_new(0x38);
  *(Private_Impl_Still **)pMVar2 = this;
  *(MMAL_POOL_T **)(pMVar2 + 8) = this->encoder_pool;
  *(sem_t **)(pMVar2 + 0x18) = &local_50;
  *(uchar **)(pMVar2 + 0x20) = preallocated_data;
  *(undefined8 *)(pMVar2 + 0x28) = 0;
  *(undefined4 *)(pMVar2 + 0x30) = 0;
  *(uint *)(pMVar2 + 0x34) = length;
  *(undefined8 *)(pMVar2 + 0x10) = 0;
  this->encoder_output_port->userdata = pMVar2;
  iVar1 = startCapture(this);
  if (iVar1 == 0) {
    sem_wait(&local_50);
    sem_destroy(&local_50);
    stopCapture(this);
  }
  operator_delete(pMVar2,0x38);
  return iVar1 == 0;
}

Assistant:

bool Private_Impl_Still::takePicture ( unsigned char * preallocated_data, unsigned int length ) {
            initialize();
            int ret = 0;
            sem_t mutex;
            sem_init ( &mutex, 0, 0 );
            RASPICAM_USERDATA * userdata = new RASPICAM_USERDATA();
            userdata->cameraBoard = this;
            userdata->encoderPool = encoder_pool;
            userdata->mutex = &mutex;
            userdata->data = preallocated_data;
            userdata->bufferPosition = 0;
            userdata->offset = 0;
            userdata->startingOffset = 0;
            userdata->length = length;
            userdata->imageCallback = NULL;
            encoder_output_port->userdata = ( struct MMAL_PORT_USERDATA_T * ) userdata;
            if ( ( ret = startCapture() ) != 0 ) {
                delete userdata;
                return false;
            }
            sem_wait ( &mutex );
            sem_destroy ( &mutex );
            stopCapture();
            delete userdata;

            return true;
        }